

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

shared_ptr<Token> __thiscall
Parser::expect(Parser *this,TokenType type,bool *error,string *errorMessage)

{
  TokenType TVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  Parser *this_00;
  element_type *in_R8;
  bool bVar3;
  shared_ptr<Token> sVar4;
  undefined1 local_158 [40];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [16];
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  undefined1 local_48 [31];
  bool foundWrongToken;
  string *errorMessage_local;
  bool *error_local;
  Parser *pPStack_18;
  TokenType type_local;
  Parser *this_local;
  shared_ptr<Token> *token;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,type);
  error_local._4_4_ = (TokenType)error;
  local_48[0x17] = 0;
  unique0x1000050d = in_R8;
  errorMessage_local = errorMessage;
  pPStack_18 = this_00;
  this_local = this;
  while( true ) {
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this_00
              );
    TokenBuffer::currentToken((TokenBuffer *)local_48);
    peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_48);
    local_70[0x17] = 0;
    bVar3 = true;
    if (peVar2->tokenType != EndOfFile) {
      std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this_00);
      TokenBuffer::currentToken((TokenBuffer *)local_58);
      local_70[0x17] = 1;
      peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_58);
      bVar3 = peVar2->tokenType != error_local._4_4_;
    }
    if ((local_70[0x17] & 1) != 0) {
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_58);
    }
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_48);
    if (!bVar3) break;
    errorMessage_local->_M_dataplus = (_Alloc_hider)0x1;
    if ((local_48[0x17] & 1) == 0) {
      std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this_00);
      TokenBuffer::currentToken((TokenBuffer *)local_70);
      peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_70);
      TVar1 = peVar2->tokenType;
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_70);
      if (TVar1 == EndOfFile) {
        std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   this_00);
        TokenBuffer::currentToken((TokenBuffer *)local_80);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_b0 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       stack0xffffffffffffffd0,".");
        reportError(this_00,(shared_ptr<Token> *)local_80,(string *)(local_b0 + 0x10));
        std::__cxx11::string::~string((string *)(local_b0 + 0x10));
        std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_80);
      }
      else {
        std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   this_00);
        TokenBuffer::currentToken((TokenBuffer *)local_b0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_120 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       stack0xffffffffffffffd0,", but was \'");
        std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   this_00);
        TokenBuffer::currentToken((TokenBuffer *)local_120);
        peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_120);
        std::operator+(&local_f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_120 + 0x10),&peVar2->value);
        std::operator+(&local_d0,&local_f0,"\'.");
        reportError(this_00,(shared_ptr<Token> *)local_b0,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_120);
        std::__cxx11::string::~string((string *)(local_120 + 0x10));
        std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_b0);
      }
    }
    local_48[0x17] = 1;
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this_00
              );
    TokenBuffer::currentToken((TokenBuffer *)local_130);
    peVar2 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_130);
    TVar1 = peVar2->tokenType;
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_130);
    if (TVar1 == EndOfFile) break;
    std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this_00
              );
    TokenBuffer::nextToken((TokenBuffer *)(local_158 + 0x18));
    std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)(local_158 + 0x18));
  }
  local_158[0x17] = 0;
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this_00);
  TokenBuffer::currentToken((TokenBuffer *)this);
  std::__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TokenBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this_00);
  TokenBuffer::nextToken((TokenBuffer *)local_158);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_158);
  sVar4.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar4.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Token>)sVar4.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token>
Parser::expect(TokenType type, bool & error, const std::string & errorMessage) noexcept {
  bool foundWrongToken = false;

  while (true) {
    if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile
        || this->tokenBuffer->currentToken()->tokenType != type) {
      error = true;

      // if this is our first error, report it
      if (!foundWrongToken) {
        if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
          this->reportError(this->tokenBuffer->currentToken(), errorMessage + ".");
        } else {
          this->reportError(this->tokenBuffer->currentToken(),
            errorMessage + ", but was '" + this->tokenBuffer->currentToken()->value + "'.");
        }
      }

      foundWrongToken = true;

      if (this->tokenBuffer->currentToken()->tokenType == TokenType::EndOfFile) {
        break;
      }

      this->tokenBuffer->nextToken();

    } else {
      break;
    }
  }

  auto token = this->tokenBuffer->currentToken();

  this->tokenBuffer->nextToken();

  return token;
}